

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ContainsOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  undefined8 *puVar1;
  ulong uVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  ulong local_40;
  unsigned_long *local_38;
  
  local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (local_38 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar6 = 8;
      iVar3 = 0;
      local_38 = (unsigned_long *)0x0;
      do {
        puVar1 = (undefined8 *)((long)ldata + lVar6 + -8);
        local_50._0_8_ = *puVar1;
        local_50.pointer.ptr = (char *)puVar1[1];
        puVar1 = (undefined8 *)((long)rdata + lVar6 + -8);
        local_60._0_8_ = *puVar1;
        local_60.pointer.ptr = (char *)puVar1[1];
        iVar4 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
        result_data[iVar3] = iVar4 != 0xffffffffffffffff;
        iVar3 = iVar3 + 1;
        lVar6 = lVar6 + 0x10;
      } while (count != iVar3);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar9 = 0;
    uVar10 = 0;
    local_40 = count;
    do {
      uVar2 = local_38[uVar9];
      uVar7 = uVar10 + 0x40;
      if (local_40 <= uVar10 + 0x40) {
        uVar7 = local_40;
      }
      uVar5 = uVar7;
      if (uVar2 != 0) {
        uVar5 = uVar10;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar10 < uVar7) {
            uVar10 = uVar10 << 4 | 8;
            do {
              puVar1 = (undefined8 *)((long)ldata + (uVar10 - 8));
              local_50._0_8_ = *puVar1;
              local_50.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + (uVar10 - 8));
              local_60._0_8_ = *puVar1;
              local_60.pointer.ptr = (char *)puVar1[1];
              iVar3 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
              result_data[uVar5] = iVar3 != 0xffffffffffffffff;
              uVar5 = uVar5 + 1;
              uVar10 = uVar10 + 0x10;
            } while (uVar7 != uVar5);
          }
        }
        else if (uVar10 < uVar7) {
          uVar11 = uVar10 << 4 | 8;
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              puVar1 = (undefined8 *)((long)ldata + (uVar11 - 8));
              local_50._0_8_ = *puVar1;
              local_50.pointer.ptr = (char *)puVar1[1];
              puVar1 = (undefined8 *)((long)rdata + (uVar11 - 8));
              local_60._0_8_ = *puVar1;
              local_60.pointer.ptr = (char *)puVar1[1];
              iVar3 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
              result_data[uVar10] = iVar3 != 0xffffffffffffffff;
            }
            uVar10 = uVar10 + 1;
            uVar11 = uVar11 + 0x10;
            uVar8 = uVar8 + 1;
            uVar5 = uVar10;
          } while (uVar7 != uVar10);
        }
      }
      uVar9 = uVar9 + 1;
      uVar10 = uVar5;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}